

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
* __thiscall
tchecker::parsing::system::parser_t::value_type::
as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
          (value_type *this)

{
  bool bVar1;
  vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
  *pvVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>>]"
                 );
  }
  bVar1 = std::type_info::operator==
                    (this->yytypeid_,
                     (type_info *)
                     &std::
                      vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>
                      ::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x145,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>>]"
                 );
  }
  pvVar2 = yyas_<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                     (this);
  return pvVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      SPYY_ASSERT (yytypeid_);
      SPYY_ASSERT (*yytypeid_ == typeid (T));
      SPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }